

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void idct8x8_new_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  undefined1 auVar23 [16];
  int iVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  int iVar34;
  int iVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar36;
  int iVar37;
  uint uVar38;
  uint uVar40;
  uint uVar41;
  undefined1 auVar39 [16];
  uint uVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  int iVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  undefined1 auVar46 [16];
  int iVar53;
  uint uVar54;
  uint uVar55;
  int iVar56;
  int iVar58;
  int iVar59;
  undefined1 auVar57 [16];
  int iVar60;
  int iVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  int iVar65;
  uint uVar66;
  int iVar67;
  uint uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar72;
  int iVar74;
  int iVar75;
  undefined1 auVar73 [16];
  int iVar76;
  int iVar77;
  uint uVar78;
  int iVar82;
  uint uVar83;
  int iVar84;
  uint uVar85;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar86;
  uint uVar87;
  int iVar88;
  int iVar91;
  int iVar92;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  int iVar93;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  lVar12 = (long)bit * 0x100;
  iVar11 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x180);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1a0);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x240);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1c0);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1e0);
  uVar4 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x220);
  iVar30 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x200);
  iVar16 = -iVar11;
  iVar14 = -iVar30;
  iVar15 = -iVar13;
  iVar17 = 1 << ((char)bit - 1U & 0x1f);
  iVar18 = bd + 6 + (uint)(do_cols == 0) * 2;
  auVar73._4_4_ = uVar1;
  auVar73._0_4_ = uVar1;
  auVar73._8_4_ = uVar1;
  auVar73._12_4_ = uVar1;
  auVar70._4_4_ = iVar16;
  auVar70._0_4_ = iVar16;
  auVar70._8_4_ = iVar16;
  auVar70._12_4_ = iVar16;
  auVar33._4_4_ = uVar2;
  auVar33._0_4_ = uVar2;
  auVar33._8_4_ = uVar2;
  auVar33._12_4_ = uVar2;
  auVar32._4_4_ = iVar14;
  auVar32._0_4_ = iVar14;
  auVar32._8_4_ = iVar14;
  auVar32._12_4_ = iVar14;
  auVar57._4_4_ = iVar30;
  auVar57._0_4_ = iVar30;
  auVar57._8_4_ = iVar30;
  auVar57._12_4_ = iVar30;
  auVar23._4_4_ = iVar11;
  auVar23._0_4_ = iVar11;
  auVar23._8_4_ = iVar11;
  auVar23._12_4_ = iVar11;
  auVar39._4_4_ = uVar3;
  auVar39._0_4_ = uVar3;
  auVar39._8_4_ = uVar3;
  auVar39._12_4_ = uVar3;
  auVar23 = pmulld(auVar23,(undefined1  [16])in[1]);
  auVar46 = pmulld((undefined1  [16])in[1],auVar73);
  auVar70 = pmulld(auVar70,(undefined1  [16])in[7]);
  auVar79 = pmulld((undefined1  [16])in[7],auVar73);
  auVar57 = pmulld(auVar57,(undefined1  [16])in[5]);
  auVar73 = pmulld((undefined1  [16])in[5],auVar33);
  auVar32 = pmulld(auVar32,(undefined1  [16])in[3]);
  auVar89 = pmulld((undefined1  [16])in[3],auVar33);
  auVar33 = pmulld((undefined1  [16])*in,auVar39);
  auVar80 = pmulld((undefined1  [16])in[4],auVar39);
  iVar30 = auVar33._0_4_ + iVar17;
  iVar14 = auVar33._4_4_ + iVar17;
  iVar16 = auVar33._8_4_ + iVar17;
  iVar36 = auVar33._12_4_ + iVar17;
  auVar71._4_4_ = uVar4;
  auVar71._0_4_ = uVar4;
  auVar71._8_4_ = uVar4;
  auVar71._12_4_ = uVar4;
  auVar81._4_4_ = iVar15;
  auVar81._0_4_ = iVar15;
  auVar81._8_4_ = iVar15;
  auVar81._12_4_ = iVar15;
  auVar69._4_4_ = iVar13;
  auVar69._0_4_ = iVar13;
  auVar69._8_4_ = iVar13;
  auVar69._12_4_ = iVar13;
  auVar69 = pmulld(auVar69,(undefined1  [16])in[2]);
  auVar90 = pmulld((undefined1  [16])in[2],auVar71);
  auVar81 = pmulld(auVar81,(undefined1  [16])in[6]);
  auVar33 = ZEXT416((uint)bit);
  iVar11 = 0x8000;
  if (0xf < iVar18) {
    iVar11 = 1 << ((char)iVar18 - 1U & 0x1f);
  }
  iVar13 = -iVar11;
  auVar71 = pmulld((undefined1  [16])in[6],auVar71);
  iVar43 = auVar46._0_4_ + iVar17 + auVar70._0_4_ >> auVar33;
  iVar47 = auVar46._4_4_ + iVar17 + auVar70._4_4_ >> auVar33;
  iVar50 = auVar46._8_4_ + iVar17 + auVar70._8_4_ >> auVar33;
  iVar53 = auVar46._12_4_ + iVar17 + auVar70._12_4_ >> auVar33;
  iVar21 = auVar23._0_4_ + iVar17 + auVar79._0_4_ >> auVar33;
  iVar24 = auVar23._4_4_ + iVar17 + auVar79._4_4_ >> auVar33;
  iVar26 = auVar23._8_4_ + iVar17 + auVar79._8_4_ >> auVar33;
  iVar28 = auVar23._12_4_ + iVar17 + auVar79._12_4_ >> auVar33;
  iVar72 = auVar73._0_4_ + iVar17 + auVar32._0_4_ >> auVar33;
  iVar74 = auVar73._4_4_ + iVar17 + auVar32._4_4_ >> auVar33;
  iVar75 = auVar73._8_4_ + iVar17 + auVar32._8_4_ >> auVar33;
  iVar76 = auVar73._12_4_ + iVar17 + auVar32._12_4_ >> auVar33;
  iVar56 = auVar57._0_4_ + iVar17 + auVar89._0_4_ >> auVar33;
  iVar58 = auVar57._4_4_ + iVar17 + auVar89._4_4_ >> auVar33;
  iVar59 = auVar57._8_4_ + iVar17 + auVar89._8_4_ >> auVar33;
  iVar60 = auVar57._12_4_ + iVar17 + auVar89._12_4_ >> auVar33;
  iVar15 = iVar30 + auVar80._0_4_ >> auVar33;
  iVar18 = iVar14 + auVar80._4_4_ >> auVar33;
  iVar19 = iVar16 + auVar80._8_4_ >> auVar33;
  iVar20 = iVar36 + auVar80._12_4_ >> auVar33;
  iVar31 = iVar30 - auVar80._0_4_ >> auVar33;
  iVar34 = iVar14 - auVar80._4_4_ >> auVar33;
  iVar35 = iVar16 - auVar80._8_4_ >> auVar33;
  iVar37 = iVar36 - auVar80._12_4_ >> auVar33;
  iVar88 = auVar90._0_4_ + iVar17 + auVar81._0_4_ >> auVar33;
  iVar91 = auVar90._4_4_ + iVar17 + auVar81._4_4_ >> auVar33;
  iVar92 = auVar90._8_4_ + iVar17 + auVar81._8_4_ >> auVar33;
  iVar93 = auVar90._12_4_ + iVar17 + auVar81._12_4_ >> auVar33;
  iVar30 = auVar69._0_4_ + iVar17 + auVar71._0_4_ >> auVar33;
  iVar14 = auVar69._4_4_ + iVar17 + auVar71._4_4_ >> auVar33;
  iVar16 = auVar69._8_4_ + iVar17 + auVar71._8_4_ >> auVar33;
  iVar36 = auVar69._12_4_ + iVar17 + auVar71._12_4_ >> auVar33;
  iVar11 = iVar11 + -1;
  iVar61 = iVar72 + iVar43;
  iVar63 = iVar74 + iVar47;
  iVar65 = iVar75 + iVar50;
  iVar67 = iVar76 + iVar53;
  iVar43 = iVar43 - iVar72;
  iVar47 = iVar47 - iVar74;
  iVar50 = iVar50 - iVar75;
  iVar53 = iVar53 - iVar76;
  iVar72 = iVar56 + iVar21;
  iVar74 = iVar58 + iVar24;
  iVar75 = iVar59 + iVar26;
  iVar76 = iVar60 + iVar28;
  iVar21 = iVar21 - iVar56;
  iVar24 = iVar24 - iVar58;
  iVar26 = iVar26 - iVar59;
  iVar28 = iVar28 - iVar60;
  iVar77 = iVar30 + iVar15;
  iVar82 = iVar14 + iVar18;
  iVar84 = iVar16 + iVar19;
  iVar86 = iVar36 + iVar20;
  iVar15 = iVar15 - iVar30;
  iVar18 = iVar18 - iVar14;
  iVar19 = iVar19 - iVar16;
  iVar20 = iVar20 - iVar36;
  iVar56 = iVar88 + iVar31;
  iVar58 = iVar91 + iVar34;
  iVar59 = iVar92 + iVar35;
  iVar60 = iVar93 + iVar37;
  iVar31 = iVar31 - iVar88;
  iVar34 = iVar34 - iVar91;
  iVar35 = iVar35 - iVar92;
  iVar37 = iVar37 - iVar93;
  uVar44 = (uint)(iVar43 < iVar13) * iVar13 | (uint)(iVar43 >= iVar13) * iVar43;
  uVar48 = (uint)(iVar47 < iVar13) * iVar13 | (uint)(iVar47 >= iVar13) * iVar47;
  uVar51 = (uint)(iVar50 < iVar13) * iVar13 | (uint)(iVar50 >= iVar13) * iVar50;
  uVar54 = (uint)(iVar53 < iVar13) * iVar13 | (uint)(iVar53 >= iVar13) * iVar53;
  auVar79._0_4_ = (uint)(iVar11 < (int)uVar44) * iVar11 | (iVar11 >= (int)uVar44) * uVar44;
  auVar79._4_4_ = (uint)(iVar11 < (int)uVar48) * iVar11 | (iVar11 >= (int)uVar48) * uVar48;
  auVar79._8_4_ = (uint)(iVar11 < (int)uVar51) * iVar11 | (iVar11 >= (int)uVar51) * uVar51;
  auVar79._12_4_ = (uint)(iVar11 < (int)uVar54) * iVar11 | (iVar11 >= (int)uVar54) * uVar54;
  uVar44 = (uint)(iVar21 < iVar13) * iVar13 | (uint)(iVar21 >= iVar13) * iVar21;
  uVar48 = (uint)(iVar24 < iVar13) * iVar13 | (uint)(iVar24 >= iVar13) * iVar24;
  uVar51 = (uint)(iVar26 < iVar13) * iVar13 | (uint)(iVar26 >= iVar13) * iVar26;
  uVar54 = (uint)(iVar28 < iVar13) * iVar13 | (uint)(iVar28 >= iVar13) * iVar28;
  auVar46._0_4_ = (uint)(iVar11 < (int)uVar44) * iVar11 | (iVar11 >= (int)uVar44) * uVar44;
  auVar46._4_4_ = (uint)(iVar11 < (int)uVar48) * iVar11 | (iVar11 >= (int)uVar48) * uVar48;
  auVar46._8_4_ = (uint)(iVar11 < (int)uVar51) * iVar11 | (iVar11 >= (int)uVar51) * uVar51;
  auVar46._12_4_ = (uint)(iVar11 < (int)uVar54) * iVar11 | (iVar11 >= (int)uVar54) * uVar54;
  auVar32 = pmulld(auVar79,auVar39);
  auVar23 = pmulld(auVar46,auVar39);
  uVar44 = (uint)(iVar72 < iVar13) * iVar13 | (uint)(iVar72 >= iVar13) * iVar72;
  uVar48 = (uint)(iVar74 < iVar13) * iVar13 | (uint)(iVar74 >= iVar13) * iVar74;
  uVar51 = (uint)(iVar75 < iVar13) * iVar13 | (uint)(iVar75 >= iVar13) * iVar75;
  uVar54 = (uint)(iVar76 < iVar13) * iVar13 | (uint)(iVar76 >= iVar13) * iVar76;
  uVar44 = (uint)(iVar11 < (int)uVar44) * iVar11 | (iVar11 >= (int)uVar44) * uVar44;
  uVar48 = (uint)(iVar11 < (int)uVar48) * iVar11 | (iVar11 >= (int)uVar48) * uVar48;
  uVar51 = (uint)(iVar11 < (int)uVar51) * iVar11 | (iVar11 >= (int)uVar51) * uVar51;
  uVar54 = (uint)(iVar11 < (int)uVar54) * iVar11 | (iVar11 >= (int)uVar54) * uVar54;
  uVar78 = (uint)(iVar77 < iVar13) * iVar13 | (uint)(iVar77 >= iVar13) * iVar77;
  uVar83 = (uint)(iVar82 < iVar13) * iVar13 | (uint)(iVar82 >= iVar13) * iVar82;
  uVar85 = (uint)(iVar84 < iVar13) * iVar13 | (uint)(iVar84 >= iVar13) * iVar84;
  uVar87 = (uint)(iVar86 < iVar13) * iVar13 | (uint)(iVar86 >= iVar13) * iVar86;
  iVar28 = auVar32._0_4_ + iVar17 + auVar23._0_4_ >> auVar33;
  iVar43 = auVar32._4_4_ + iVar17 + auVar23._4_4_ >> auVar33;
  iVar47 = auVar32._8_4_ + iVar17 + auVar23._8_4_ >> auVar33;
  iVar50 = auVar32._12_4_ + iVar17 + auVar23._12_4_ >> auVar33;
  uVar78 = (uint)(iVar11 < (int)uVar78) * iVar11 | (iVar11 >= (int)uVar78) * uVar78;
  uVar83 = (uint)(iVar11 < (int)uVar83) * iVar11 | (iVar11 >= (int)uVar83) * uVar83;
  uVar85 = (uint)(iVar11 < (int)uVar85) * iVar11 | (iVar11 >= (int)uVar85) * uVar85;
  uVar87 = (uint)(iVar11 < (int)uVar87) * iVar11 | (iVar11 >= (int)uVar87) * uVar87;
  iVar30 = (iVar17 - auVar32._0_4_) + auVar23._0_4_ >> auVar33;
  iVar14 = (iVar17 - auVar32._4_4_) + auVar23._4_4_ >> auVar33;
  iVar16 = (iVar17 - auVar32._8_4_) + auVar23._8_4_ >> auVar33;
  iVar17 = (iVar17 - auVar32._12_4_) + auVar23._12_4_ >> auVar33;
  iVar36 = uVar78 + uVar44;
  iVar21 = uVar83 + uVar48;
  iVar24 = uVar85 + uVar51;
  iVar26 = uVar87 + uVar54;
  iVar53 = uVar78 - uVar44;
  iVar72 = uVar83 - uVar48;
  iVar74 = uVar85 - uVar51;
  iVar75 = uVar87 - uVar54;
  uVar44 = (uint)(iVar56 < iVar13) * iVar13 | (uint)(iVar56 >= iVar13) * iVar56;
  uVar48 = (uint)(iVar58 < iVar13) * iVar13 | (uint)(iVar58 >= iVar13) * iVar58;
  uVar51 = (uint)(iVar59 < iVar13) * iVar13 | (uint)(iVar59 >= iVar13) * iVar59;
  uVar54 = (uint)(iVar60 < iVar13) * iVar13 | (uint)(iVar60 >= iVar13) * iVar60;
  uVar78 = (uint)(iVar11 < (int)uVar44) * iVar11 | (iVar11 >= (int)uVar44) * uVar44;
  uVar83 = (uint)(iVar11 < (int)uVar48) * iVar11 | (iVar11 >= (int)uVar48) * uVar48;
  uVar85 = (uint)(iVar11 < (int)uVar51) * iVar11 | (iVar11 >= (int)uVar51) * uVar51;
  uVar87 = (uint)(iVar11 < (int)uVar54) * iVar11 | (iVar11 >= (int)uVar54) * uVar54;
  uVar44 = (uint)(iVar36 < iVar13) * iVar13 | (uint)(iVar36 >= iVar13) * iVar36;
  uVar48 = (uint)(iVar21 < iVar13) * iVar13 | (uint)(iVar21 >= iVar13) * iVar21;
  uVar51 = (uint)(iVar24 < iVar13) * iVar13 | (uint)(iVar24 >= iVar13) * iVar24;
  uVar54 = (uint)(iVar26 < iVar13) * iVar13 | (uint)(iVar26 >= iVar13) * iVar26;
  uVar22 = (uint)(iVar11 < (int)uVar44) * iVar11 | (iVar11 >= (int)uVar44) * uVar44;
  uVar25 = (uint)(iVar11 < (int)uVar48) * iVar11 | (iVar11 >= (int)uVar48) * uVar48;
  uVar27 = (uint)(iVar11 < (int)uVar51) * iVar11 | (iVar11 >= (int)uVar51) * uVar51;
  uVar29 = (uint)(iVar11 < (int)uVar54) * iVar11 | (iVar11 >= (int)uVar54) * uVar54;
  uVar44 = (uint)(iVar53 < iVar13) * iVar13 | (uint)(iVar53 >= iVar13) * iVar53;
  uVar48 = (uint)(iVar72 < iVar13) * iVar13 | (uint)(iVar72 >= iVar13) * iVar72;
  uVar51 = (uint)(iVar74 < iVar13) * iVar13 | (uint)(iVar74 >= iVar13) * iVar74;
  uVar54 = (uint)(iVar75 < iVar13) * iVar13 | (uint)(iVar75 >= iVar13) * iVar75;
  *(uint *)*out = uVar22;
  *(uint *)((long)*out + 4) = uVar25;
  *(uint *)(*out + 1) = uVar27;
  *(uint *)((long)*out + 0xc) = uVar29;
  *(uint *)out[7] = (uint)(iVar11 < (int)uVar44) * iVar11 | (iVar11 >= (int)uVar44) * uVar44;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar11 < (int)uVar48) * iVar11 | (iVar11 >= (int)uVar48) * uVar48;
  *(uint *)(out[7] + 1) = (uint)(iVar11 < (int)uVar51) * iVar11 | (iVar11 >= (int)uVar51) * uVar51;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar11 < (int)uVar54) * iVar11 | (iVar11 >= (int)uVar54) * uVar54;
  iVar36 = uVar78 + iVar28;
  iVar21 = uVar83 + iVar43;
  iVar24 = uVar85 + iVar47;
  iVar26 = uVar87 + iVar50;
  iVar28 = uVar78 - iVar28;
  iVar43 = uVar83 - iVar43;
  iVar47 = uVar85 - iVar47;
  iVar50 = uVar87 - iVar50;
  uVar44 = (uint)(iVar31 < iVar13) * iVar13 | (uint)(iVar31 >= iVar13) * iVar31;
  uVar48 = (uint)(iVar34 < iVar13) * iVar13 | (uint)(iVar34 >= iVar13) * iVar34;
  uVar51 = (uint)(iVar35 < iVar13) * iVar13 | (uint)(iVar35 >= iVar13) * iVar35;
  uVar54 = (uint)(iVar37 < iVar13) * iVar13 | (uint)(iVar37 >= iVar13) * iVar37;
  uVar44 = (uint)(iVar11 < (int)uVar44) * iVar11 | (iVar11 >= (int)uVar44) * uVar44;
  uVar48 = (uint)(iVar11 < (int)uVar48) * iVar11 | (iVar11 >= (int)uVar48) * uVar48;
  uVar51 = (uint)(iVar11 < (int)uVar51) * iVar11 | (iVar11 >= (int)uVar51) * uVar51;
  uVar54 = (uint)(iVar11 < (int)uVar54) * iVar11 | (iVar11 >= (int)uVar54) * uVar54;
  uVar78 = (uint)(iVar36 < iVar13) * iVar13 | (uint)(iVar36 >= iVar13) * iVar36;
  uVar83 = (uint)(iVar21 < iVar13) * iVar13 | (uint)(iVar21 >= iVar13) * iVar21;
  uVar85 = (uint)(iVar24 < iVar13) * iVar13 | (uint)(iVar24 >= iVar13) * iVar24;
  uVar87 = (uint)(iVar26 < iVar13) * iVar13 | (uint)(iVar26 >= iVar13) * iVar26;
  uVar38 = (uint)(iVar11 < (int)uVar78) * iVar11 | (iVar11 >= (int)uVar78) * uVar78;
  uVar40 = (uint)(iVar11 < (int)uVar83) * iVar11 | (iVar11 >= (int)uVar83) * uVar83;
  uVar41 = (uint)(iVar11 < (int)uVar85) * iVar11 | (iVar11 >= (int)uVar85) * uVar85;
  uVar42 = (uint)(iVar11 < (int)uVar87) * iVar11 | (iVar11 >= (int)uVar87) * uVar87;
  uVar78 = (uint)(iVar28 < iVar13) * iVar13 | (uint)(iVar28 >= iVar13) * iVar28;
  uVar83 = (uint)(iVar43 < iVar13) * iVar13 | (uint)(iVar43 >= iVar13) * iVar43;
  uVar85 = (uint)(iVar47 < iVar13) * iVar13 | (uint)(iVar47 >= iVar13) * iVar47;
  uVar87 = (uint)(iVar50 < iVar13) * iVar13 | (uint)(iVar50 >= iVar13) * iVar50;
  *(uint *)out[1] = uVar38;
  *(uint *)((long)out[1] + 4) = uVar40;
  *(uint *)(out[1] + 1) = uVar41;
  *(uint *)((long)out[1] + 0xc) = uVar42;
  *(uint *)out[6] = (uint)(iVar11 < (int)uVar78) * iVar11 | (iVar11 >= (int)uVar78) * uVar78;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar11 < (int)uVar83) * iVar11 | (iVar11 >= (int)uVar83) * uVar83;
  *(uint *)(out[6] + 1) = (uint)(iVar11 < (int)uVar85) * iVar11 | (iVar11 >= (int)uVar85) * uVar85;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar11 < (int)uVar87) * iVar11 | (iVar11 >= (int)uVar87) * uVar87;
  iVar36 = iVar30 + uVar44;
  iVar21 = iVar14 + uVar48;
  iVar24 = iVar16 + uVar51;
  iVar26 = iVar17 + uVar54;
  iVar30 = uVar44 - iVar30;
  iVar14 = uVar48 - iVar14;
  iVar16 = uVar51 - iVar16;
  iVar17 = uVar54 - iVar17;
  uVar44 = (uint)(iVar61 < iVar13) * iVar13 | (uint)(iVar61 >= iVar13) * iVar61;
  uVar48 = (uint)(iVar63 < iVar13) * iVar13 | (uint)(iVar63 >= iVar13) * iVar63;
  uVar51 = (uint)(iVar65 < iVar13) * iVar13 | (uint)(iVar65 >= iVar13) * iVar65;
  uVar54 = (uint)(iVar67 < iVar13) * iVar13 | (uint)(iVar67 >= iVar13) * iVar67;
  uVar62 = (uint)(iVar11 < (int)uVar44) * iVar11 | (iVar11 >= (int)uVar44) * uVar44;
  uVar64 = (uint)(iVar11 < (int)uVar48) * iVar11 | (iVar11 >= (int)uVar48) * uVar48;
  uVar66 = (uint)(iVar11 < (int)uVar51) * iVar11 | (iVar11 >= (int)uVar51) * uVar51;
  uVar68 = (uint)(iVar11 < (int)uVar54) * iVar11 | (iVar11 >= (int)uVar54) * uVar54;
  uVar44 = (uint)(iVar15 < iVar13) * iVar13 | (uint)(iVar15 >= iVar13) * iVar15;
  uVar48 = (uint)(iVar18 < iVar13) * iVar13 | (uint)(iVar18 >= iVar13) * iVar18;
  uVar51 = (uint)(iVar19 < iVar13) * iVar13 | (uint)(iVar19 >= iVar13) * iVar19;
  uVar54 = (uint)(iVar20 < iVar13) * iVar13 | (uint)(iVar20 >= iVar13) * iVar20;
  uVar44 = (uint)(iVar11 < (int)uVar44) * iVar11 | (iVar11 >= (int)uVar44) * uVar44;
  uVar48 = (uint)(iVar11 < (int)uVar48) * iVar11 | (iVar11 >= (int)uVar48) * uVar48;
  uVar51 = (uint)(iVar11 < (int)uVar51) * iVar11 | (iVar11 >= (int)uVar51) * uVar51;
  uVar54 = (uint)(iVar11 < (int)uVar54) * iVar11 | (iVar11 >= (int)uVar54) * uVar54;
  uVar78 = (uint)(iVar36 < iVar13) * iVar13 | (uint)(iVar36 >= iVar13) * iVar36;
  uVar83 = (uint)(iVar21 < iVar13) * iVar13 | (uint)(iVar21 >= iVar13) * iVar21;
  uVar85 = (uint)(iVar24 < iVar13) * iVar13 | (uint)(iVar24 >= iVar13) * iVar24;
  uVar87 = (uint)(iVar26 < iVar13) * iVar13 | (uint)(iVar26 >= iVar13) * iVar26;
  uVar45 = (uint)(iVar11 < (int)uVar78) * iVar11 | (iVar11 >= (int)uVar78) * uVar78;
  uVar49 = (uint)(iVar11 < (int)uVar83) * iVar11 | (iVar11 >= (int)uVar83) * uVar83;
  uVar52 = (uint)(iVar11 < (int)uVar85) * iVar11 | (iVar11 >= (int)uVar85) * uVar85;
  uVar55 = (uint)(iVar11 < (int)uVar87) * iVar11 | (iVar11 >= (int)uVar87) * uVar87;
  uVar78 = (uint)(iVar30 < iVar13) * iVar13 | (uint)(iVar30 >= iVar13) * iVar30;
  uVar83 = (uint)(iVar14 < iVar13) * iVar13 | (uint)(iVar14 >= iVar13) * iVar14;
  uVar85 = (uint)(iVar16 < iVar13) * iVar13 | (uint)(iVar16 >= iVar13) * iVar16;
  uVar87 = (uint)(iVar17 < iVar13) * iVar13 | (uint)(iVar17 >= iVar13) * iVar17;
  *(uint *)out[2] = uVar45;
  *(uint *)((long)out[2] + 4) = uVar49;
  *(uint *)(out[2] + 1) = uVar52;
  *(uint *)((long)out[2] + 0xc) = uVar55;
  *(uint *)out[5] = (uint)(iVar11 < (int)uVar78) * iVar11 | (iVar11 >= (int)uVar78) * uVar78;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar11 < (int)uVar83) * iVar11 | (iVar11 >= (int)uVar83) * uVar83;
  *(uint *)(out[5] + 1) = (uint)(iVar11 < (int)uVar85) * iVar11 | (iVar11 >= (int)uVar85) * uVar85;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar11 < (int)uVar87) * iVar11 | (iVar11 >= (int)uVar87) * uVar87;
  iVar17 = uVar44 + uVar62;
  iVar18 = uVar48 + uVar64;
  iVar36 = uVar51 + uVar66;
  iVar19 = uVar54 + uVar68;
  iVar30 = uVar44 - uVar62;
  iVar14 = uVar48 - uVar64;
  iVar15 = uVar51 - uVar66;
  iVar16 = uVar54 - uVar68;
  uVar78 = (uint)(iVar17 < iVar13) * iVar13 | (uint)(iVar17 >= iVar13) * iVar17;
  uVar83 = (uint)(iVar18 < iVar13) * iVar13 | (uint)(iVar18 >= iVar13) * iVar18;
  uVar85 = (uint)(iVar36 < iVar13) * iVar13 | (uint)(iVar36 >= iVar13) * iVar36;
  uVar87 = (uint)(iVar19 < iVar13) * iVar13 | (uint)(iVar19 >= iVar13) * iVar19;
  uVar44 = (uint)(iVar30 < iVar13) * iVar13 | (uint)(iVar30 >= iVar13) * iVar30;
  uVar48 = (uint)(iVar14 < iVar13) * iVar13 | (uint)(iVar14 >= iVar13) * iVar14;
  uVar51 = (uint)(iVar15 < iVar13) * iVar13 | (uint)(iVar15 >= iVar13) * iVar15;
  uVar54 = (uint)(iVar16 < iVar13) * iVar13 | (uint)(iVar16 >= iVar13) * iVar16;
  uVar78 = (uint)(iVar11 < (int)uVar78) * iVar11 | (iVar11 >= (int)uVar78) * uVar78;
  uVar83 = (uint)(iVar11 < (int)uVar83) * iVar11 | (iVar11 >= (int)uVar83) * uVar83;
  uVar85 = (uint)(iVar11 < (int)uVar85) * iVar11 | (iVar11 >= (int)uVar85) * uVar85;
  uVar87 = (uint)(iVar11 < (int)uVar87) * iVar11 | (iVar11 >= (int)uVar87) * uVar87;
  uVar44 = (uint)(iVar11 < (int)uVar44) * iVar11 | (iVar11 >= (int)uVar44) * uVar44;
  uVar48 = (uint)(iVar11 < (int)uVar48) * iVar11 | (iVar11 >= (int)uVar48) * uVar48;
  uVar51 = (uint)(iVar11 < (int)uVar51) * iVar11 | (iVar11 >= (int)uVar51) * uVar51;
  uVar54 = (uint)(iVar11 < (int)uVar54) * iVar11 | (iVar11 >= (int)uVar54) * uVar54;
  *(uint *)out[3] = uVar78;
  *(uint *)((long)out[3] + 4) = uVar83;
  *(uint *)(out[3] + 1) = uVar85;
  *(uint *)((long)out[3] + 0xc) = uVar87;
  *(uint *)out[4] = uVar44;
  *(uint *)((long)out[4] + 4) = uVar48;
  *(uint *)(out[4] + 1) = uVar51;
  *(uint *)((long)out[4] + 0xc) = uVar54;
  if (do_cols == 0) {
    iVar11 = 10;
    if (10 < bd) {
      iVar11 = bd;
    }
    local_28 = 0x20 << ((byte)iVar11 & 0x1f);
    local_18 = -local_28;
    local_28 = local_28 + -1;
    if (out_shift != 0) {
      iVar17 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar33 = ZEXT416((uint)out_shift);
      *(int *)*out = (int)(uVar22 + iVar17) >> auVar33;
      *(int *)((long)*out + 4) = (int)(uVar25 + iVar17) >> auVar33;
      *(int *)(*out + 1) = (int)(uVar27 + iVar17) >> auVar33;
      *(int *)((long)*out + 0xc) = (int)(uVar29 + iVar17) >> auVar33;
      *(int *)out[1] = (int)(uVar38 + iVar17) >> auVar33;
      *(int *)((long)out[1] + 4) = (int)(uVar40 + iVar17) >> auVar33;
      *(int *)(out[1] + 1) = (int)(uVar41 + iVar17) >> auVar33;
      *(int *)((long)out[1] + 0xc) = (int)(uVar42 + iVar17) >> auVar33;
      *(int *)out[2] = (int)(uVar45 + iVar17) >> auVar33;
      *(int *)((long)out[2] + 4) = (int)(uVar49 + iVar17) >> auVar33;
      *(int *)(out[2] + 1) = (int)(uVar52 + iVar17) >> auVar33;
      *(int *)((long)out[2] + 0xc) = (int)(uVar55 + iVar17) >> auVar33;
      *(int *)out[3] = (int)(uVar78 + iVar17) >> auVar33;
      *(int *)((long)out[3] + 4) = (int)(uVar83 + iVar17) >> auVar33;
      *(int *)(out[3] + 1) = (int)(uVar85 + iVar17) >> auVar33;
      *(int *)((long)out[3] + 0xc) = (int)(uVar87 + iVar17) >> auVar33;
      lVar5 = out[5][0];
      iVar11 = *(int *)((long)out[5] + 4);
      lVar6 = out[5][1];
      iVar13 = *(int *)((long)out[5] + 0xc);
      lVar7 = out[6][0];
      iVar30 = *(int *)((long)out[6] + 4);
      lVar8 = out[6][1];
      iVar14 = *(int *)((long)out[6] + 0xc);
      lVar9 = out[7][0];
      iVar15 = *(int *)((long)out[7] + 4);
      lVar10 = out[7][1];
      iVar16 = *(int *)((long)out[7] + 0xc);
      *(int *)out[4] = (int)(uVar44 + iVar17) >> auVar33;
      *(int *)((long)out[4] + 4) = (int)(uVar48 + iVar17) >> auVar33;
      *(int *)(out[4] + 1) = (int)(uVar51 + iVar17) >> auVar33;
      *(int *)((long)out[4] + 0xc) = (int)(uVar54 + iVar17) >> auVar33;
      *(int *)out[5] = (int)lVar5 + iVar17 >> auVar33;
      *(int *)((long)out[5] + 4) = iVar11 + iVar17 >> auVar33;
      *(int *)(out[5] + 1) = (int)lVar6 + iVar17 >> auVar33;
      *(int *)((long)out[5] + 0xc) = iVar13 + iVar17 >> auVar33;
      *(int *)out[6] = (int)lVar7 + iVar17 >> auVar33;
      *(int *)((long)out[6] + 4) = iVar30 + iVar17 >> auVar33;
      *(int *)(out[6] + 1) = (int)lVar8 + iVar17 >> auVar33;
      *(int *)((long)out[6] + 0xc) = iVar14 + iVar17 >> auVar33;
      *(int *)out[7] = iVar17 + (int)lVar9 >> auVar33;
      *(int *)((long)out[7] + 4) = iVar17 + iVar15 >> auVar33;
      *(int *)(out[7] + 1) = iVar17 + (int)lVar10 >> auVar33;
      *(int *)((long)out[7] + 0xc) = iVar17 + iVar16 >> auVar33;
    }
    iStack_24 = local_28;
    iStack_20 = local_28;
    iStack_1c = local_28;
    iStack_14 = local_18;
    iStack_10 = local_18;
    iStack_c = local_18;
    highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_18,(__m128i *)&local_28,8);
  }
  return;
}

Assistant:

static void idct8x8_new_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x, y;

  // stage 0
  // stage 1
  // stage 2
  u0 = in[0];
  u1 = in[4];
  u2 = in[2];
  u3 = in[6];

  x = _mm_mullo_epi32(in[1], cospi56);
  y = _mm_mullo_epi32(in[7], cospim8);
  u4 = _mm_add_epi32(x, y);
  u4 = _mm_add_epi32(u4, rnding);
  u4 = _mm_srai_epi32(u4, bit);

  x = _mm_mullo_epi32(in[1], cospi8);
  y = _mm_mullo_epi32(in[7], cospi56);
  u7 = _mm_add_epi32(x, y);
  u7 = _mm_add_epi32(u7, rnding);
  u7 = _mm_srai_epi32(u7, bit);

  x = _mm_mullo_epi32(in[5], cospi24);
  y = _mm_mullo_epi32(in[3], cospim40);
  u5 = _mm_add_epi32(x, y);
  u5 = _mm_add_epi32(u5, rnding);
  u5 = _mm_srai_epi32(u5, bit);

  x = _mm_mullo_epi32(in[5], cospi40);
  y = _mm_mullo_epi32(in[3], cospi24);
  u6 = _mm_add_epi32(x, y);
  u6 = _mm_add_epi32(u6, rnding);
  u6 = _mm_srai_epi32(u6, bit);

  // stage 3
  x = _mm_mullo_epi32(u0, cospi32);
  y = _mm_mullo_epi32(u1, cospi32);
  v0 = _mm_add_epi32(x, y);
  v0 = _mm_add_epi32(v0, rnding);
  v0 = _mm_srai_epi32(v0, bit);

  v1 = _mm_sub_epi32(x, y);
  v1 = _mm_add_epi32(v1, rnding);
  v1 = _mm_srai_epi32(v1, bit);

  x = _mm_mullo_epi32(u2, cospi48);
  y = _mm_mullo_epi32(u3, cospim16);
  v2 = _mm_add_epi32(x, y);
  v2 = _mm_add_epi32(v2, rnding);
  v2 = _mm_srai_epi32(v2, bit);

  x = _mm_mullo_epi32(u2, cospi16);
  y = _mm_mullo_epi32(u3, cospi48);
  v3 = _mm_add_epi32(x, y);
  v3 = _mm_add_epi32(v3, rnding);
  v3 = _mm_srai_epi32(v3, bit);

  addsub_sse4_1(u4, u5, &v4, &v5, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u7, u6, &v7, &v6, &clamp_lo, &clamp_hi);

  // stage 4
  addsub_sse4_1(v0, v3, &u0, &u3, &clamp_lo, &clamp_hi);
  addsub_sse4_1(v1, v2, &u1, &u2, &clamp_lo, &clamp_hi);
  u4 = v4;
  u7 = v7;

  x = _mm_mullo_epi32(v5, cospi32);
  y = _mm_mullo_epi32(v6, cospi32);
  u6 = _mm_add_epi32(y, x);
  u6 = _mm_add_epi32(u6, rnding);
  u6 = _mm_srai_epi32(u6, bit);

  u5 = _mm_sub_epi32(y, x);
  u5 = _mm_add_epi32(u5, rnding);
  u5 = _mm_srai_epi32(u5, bit);

  // stage 5
  addsub_sse4_1(u0, u7, out + 0, out + 7, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u1, u6, out + 1, out + 6, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u2, u5, out + 2, out + 5, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u3, u4, out + 3, out + 4, &clamp_lo, &clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    round_shift_4x4(out, out_shift);
    round_shift_4x4(out + 4, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 8);
  }
}